

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedBreakIterator::preceding(RuleBasedBreakIterator *this,int32_t offset)

{
  int64_t iVar1;
  int local_3c;
  UErrorCode local_24;
  int32_t local_20;
  UErrorCode status;
  int32_t adjustedOffset;
  int32_t offset_local;
  RuleBasedBreakIterator *this_local;
  
  status = offset;
  _adjustedOffset = this;
  iVar1 = utext_nativeLength_63(&this->fText);
  if (iVar1 < offset) {
    this_local._4_4_ = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xb])();
  }
  else {
    utext_setNativeIndex_63(&this->fText,(long)status);
    iVar1 = utext_getNativeIndex_63(&this->fText);
    local_20 = (int32_t)iVar1;
    local_24 = U_ZERO_ERROR;
    BreakCache::preceding(this->fBreakCache,local_20,&local_24);
    if (this->fDone == '\0') {
      local_3c = this->fPosition;
    }
    else {
      local_3c = -1;
    }
    this_local._4_4_ = local_3c;
  }
  return this_local._4_4_;
}

Assistant:

int32_t RuleBasedBreakIterator::preceding(int32_t offset) {
    if (offset > utext_nativeLength(&fText)) {
        return last();
    }

    // Move requested offset to a code point start. It might be on a trail surrogate,
    // or on a trail byte if the input is UTF-8.

    utext_setNativeIndex(&fText, offset);
    int32_t adjustedOffset = static_cast<int32_t>(utext_getNativeIndex(&fText));

    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->preceding(adjustedOffset, status);
    return fDone ? UBRK_DONE : fPosition;
}